

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rbuVfsFileControl(sqlite3_file *pFile,int op,void *pArg)

{
  sqlite3_io_methods *psVar1;
  code *pcVar2;
  int iVar3;
  char *pcVar4;
  sqlite3rbu *pRbu;
  void *dummy;
  
  psVar1 = pFile[1].pMethods;
  pcVar2 = *(code **)(*(long *)psVar1 + 0x50);
  if (op == 0x4e9220) {
    *(int *)((long)pArg + 0x160) = *(int *)((long)pArg + 0x160) + 1;
    *(sqlite3_file **)((long)pArg + 0x168) = pFile;
    *(undefined1 *)((long)&pFile[6].pMethods + 1) = 1;
  }
  else if (op == 0x1a) {
    iVar3 = (*pcVar2)(psVar1,0x1a,pArg);
    if (iVar3 != 0xc) {
      return iVar3;
    }
    iVar3 = (*pcVar2)(pFile[1].pMethods,0x19);
    if (iVar3 != 0xc) {
      if (iVar3 != 0) {
        return iVar3;
      }
      pcVar4 = sqlite3_mprintf("rbu/zipvfs setup error");
      *(char **)((long)pArg + 0x40) = pcVar4;
      return 1;
    }
    *(sqlite3_file **)((long)pArg + 0x100) = pFile;
    pFile[3].pMethods = (sqlite3_io_methods *)pArg;
    if (((ulong)pFile[5].pMethods & 0x100) != 0) {
      rbuMainlistAdd((rbu_file *)pFile);
    }
    if (pFile[10].pMethods == (sqlite3_io_methods *)0x0) {
      return 0;
    }
    (pFile[10].pMethods)->xWrite = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)pArg;
    return 0;
  }
  iVar3 = (*pcVar2)(psVar1,op,pArg);
  if (op == 0xc && iVar3 == 0) {
    pcVar4 = sqlite3_mprintf("rbu(%s)/%z",(pFile[2].pMethods)->xWrite,*pArg);
    *(char **)pArg = pcVar4;
    iVar3 = 7;
    if (pcVar4 != (char *)0x0) {
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int rbuVfsFileControl(sqlite3_file *pFile, int op, void *pArg){
  rbu_file *p = (rbu_file *)pFile;
  int (*xControl)(sqlite3_file*,int,void*) = p->pReal->pMethods->xFileControl;
  int rc;

  assert( p->openFlags & (SQLITE_OPEN_MAIN_DB|SQLITE_OPEN_TEMP_DB)
       || p->openFlags & (SQLITE_OPEN_TRANSIENT_DB|SQLITE_OPEN_TEMP_JOURNAL)
  );
  if( op==SQLITE_FCNTL_RBU ){
    sqlite3rbu *pRbu = (sqlite3rbu*)pArg;

    /* First try to find another RBU vfs lower down in the vfs stack. If
    ** one is found, this vfs will operate in pass-through mode. The lower
    ** level vfs will do the special RBU handling.  */
    rc = xControl(p->pReal, op, pArg);

    if( rc==SQLITE_NOTFOUND ){
      /* Now search for a zipvfs instance lower down in the VFS stack. If
      ** one is found, this is an error.  */
      void *dummy = 0;
      rc = xControl(p->pReal, SQLITE_FCNTL_ZIPVFS, &dummy);
      if( rc==SQLITE_OK ){
        rc = SQLITE_ERROR;
        pRbu->zErrmsg = sqlite3_mprintf("rbu/zipvfs setup error");
      }else if( rc==SQLITE_NOTFOUND ){
        pRbu->pTargetFd = p;
        p->pRbu = pRbu;
        if( p->openFlags & SQLITE_OPEN_MAIN_DB ){
          rbuMainlistAdd(p);
        }
        if( p->pWalFd ) p->pWalFd->pRbu = pRbu;
        rc = SQLITE_OK;
      }
    }
    return rc;
  }
  else if( op==SQLITE_FCNTL_RBUCNT ){
    sqlite3rbu *pRbu = (sqlite3rbu*)pArg;
    pRbu->nRbu++;
    pRbu->pRbuFd = p;
    p->bNolock = 1;
  }

  rc = xControl(p->pReal, op, pArg);
  if( rc==SQLITE_OK && op==SQLITE_FCNTL_VFSNAME ){
    rbu_vfs *pRbuVfs = p->pRbuVfs;
    char *zIn = *(char**)pArg;
    char *zOut = sqlite3_mprintf("rbu(%s)/%z", pRbuVfs->base.zName, zIn);
    *(char**)pArg = zOut;
    if( zOut==0 ) rc = SQLITE_NOMEM;
  }

  return rc;
}